

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O2

vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_> * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getAllLoops
          (vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
           *__return_storage_ptr__,KcpTcpEventLoopThreadPool *this)

{
  allocator_type local_19;
  
  EventLoop::assertInLoopThread(&this->m_baseLoop->super_EventLoop);
  if (this->m_started != false) {
    if ((this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,1,&this->m_baseLoop,&local_19);
    }
    else {
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,&this->m_loops);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x5b,
                "std::vector<KcpTcpEventLoop *> sznet::net::KcpTcpEventLoopThreadPool::getAllLoops()"
               );
}

Assistant:

std::vector<KcpTcpEventLoop*> KcpTcpEventLoopThreadPool::getAllLoops()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	if (m_loops.empty())
	{
		return std::vector<KcpTcpEventLoop*>(1, m_baseLoop);
	}
	else
	{
		return m_loops;
	}
}